

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

Function * __thiscall
wasm::anon_unknown_18::Inlining::getActuallyInlinedFunction(Inlining *this,Function *func)

{
  InliningMode inliningMode_00;
  bool bVar1;
  mapped_type *pmVar2;
  pointer this_00;
  InliningMode inliningMode;
  Function *func_local;
  Inlining *this_local;
  
  pmVar2 = std::
           unordered_map<wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::(anonymous_namespace)::FunctionInfo>_>_>
           ::operator[](&this->infos,(key_type *)func);
  inliningMode_00 = pmVar2->inliningMode;
  this_local = (Inlining *)func;
  if (inliningMode_00 != Full) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->functionSplitter);
    if (!bVar1) {
      __assert_fail("functionSplitter",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Inlining.cpp"
                    ,0x5a3,
                    "Function *wasm::(anonymous namespace)::Inlining::getActuallyInlinedFunction(Function *)"
                   );
    }
    this_00 = std::
              unique_ptr<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
              ::operator->(&this->functionSplitter);
    this_local = (Inlining *)
                 FunctionSplitter::getInlineableSplitFunction(this_00,func,inliningMode_00);
  }
  return (Function *)this_local;
}

Assistant:

Function* getActuallyInlinedFunction(Function* func) {
    InliningMode inliningMode = infos[func->name].inliningMode;
    // If we want to inline this function itself, do so.
    if (inliningMode == InliningMode::Full) {
      return func;
    }

    // Otherwise, this is a case where we want to inline part of it, after
    // splitting.
    assert(functionSplitter);
    return functionSplitter->getInlineableSplitFunction(func, inliningMode);
  }